

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool GGUFMeta::GKV<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::validate_override(llama_model_kv_override_type expected_type,llama_model_kv_override *ovrd)

{
  char *pcVar1;
  runtime_error *this;
  char *pcVar2;
  llama_model_kv_override_type *in_RSI;
  llama_model_kv_override_type in_EDI;
  string local_30 [32];
  llama_model_kv_override_type *local_10;
  bool local_1;
  
  if (in_RSI == (llama_model_kv_override_type *)0x0) {
    local_1 = false;
  }
  else {
    local_10 = in_RSI;
    if (*in_RSI == in_EDI) {
      pcVar1 = override_type_to_str(*in_RSI);
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: Using metadata override (%5s) \'%s\' = ",
                         "validate_override",pcVar1,local_10 + 1);
      switch(*local_10) {
      case LLAMA_KV_OVERRIDE_TYPE_INT:
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%ld\n",*(undefined8 *)(local_10 + 0x22));
        break;
      case LLAMA_KV_OVERRIDE_TYPE_FLOAT:
        llama_log_internal(local_10[0x22],(char *)0x2,"%.6f\n");
        break;
      case LLAMA_KV_OVERRIDE_TYPE_BOOL:
        pcVar1 = "false";
        if ((local_10[0x22] & LLAMA_KV_OVERRIDE_TYPE_FLOAT) != LLAMA_KV_OVERRIDE_TYPE_INT) {
          pcVar1 = "true";
        }
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s\n",pcVar1);
        break;
      case LLAMA_KV_OVERRIDE_TYPE_STR:
        llama_log_internal(GGML_LOG_LEVEL_INFO,"%s\n",local_10 + 0x22);
        break;
      default:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar1 = override_type_to_str(*local_10);
        format_abi_cxx11_((char *)local_30,
                          "Unsupported attempt to override %s type for metadata key %s\n",pcVar1,
                          local_10 + 1);
        std::runtime_error::runtime_error(this,local_30);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1 = true;
    }
    else {
      pcVar1 = override_type_to_str(in_EDI);
      pcVar2 = override_type_to_str(*local_10);
      llama_log_internal(GGML_LOG_LEVEL_WARN,
                         "%s: Warning: Bad metadata override type for key \'%s\', expected %s but got %s\n"
                         ,"validate_override",in_RSI + 1,pcVar1,pcVar2);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool validate_override(const llama_model_kv_override_type expected_type, const struct llama_model_kv_override * ovrd) {
            if (!ovrd) { return false; }
            if (ovrd->tag == expected_type) {
                LLAMA_LOG_INFO("%s: Using metadata override (%5s) '%s' = ",
                    __func__, override_type_to_str(ovrd->tag), ovrd->key);
                switch (ovrd->tag) {
                    case LLAMA_KV_OVERRIDE_TYPE_BOOL:  {
                        LLAMA_LOG_INFO("%s\n", ovrd->val_bool ? "true" : "false");
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_INT:   {
                        LLAMA_LOG_INFO("%" PRId64 "\n", ovrd->val_i64);
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_FLOAT: {
                        LLAMA_LOG_INFO("%.6f\n", ovrd->val_f64);
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_STR: {
                        LLAMA_LOG_INFO("%s\n", ovrd->val_str);
                    } break;
                    default:
                        // Shouldn't be possible to end up here, but just in case...
                        throw std::runtime_error(
                            format("Unsupported attempt to override %s type for metadata key %s\n",
                                override_type_to_str(ovrd->tag), ovrd->key));
                }
                return true;
            }
            LLAMA_LOG_WARN("%s: Warning: Bad metadata override type for key '%s', expected %s but got %s\n",
                __func__, ovrd->key, override_type_to_str(expected_type), override_type_to_str(ovrd->tag));
            return false;
        }